

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<baryonyx::solver_parameters::pre_constraint_order,fmt::v7::formatter<baryonyx::solver_parameters::pre_constraint_order,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  undefined8 this;
  iterator it;
  iterator it_00;
  undefined1 local_60 [8];
  formatter<baryonyx::solver_parameters::pre_constraint_order,_char,_void> f;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  parse_context_type *parse_ctx_local;
  void *arg_local;
  
  f.super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.name.
  size_ = (size_t)ctx;
  formatter<baryonyx::solver_parameters::pre_constraint_order,_char,_void>::formatter
            ((formatter<baryonyx::solver_parameters::pre_constraint_order,_char,_void> *)local_60);
  it = formatter<fmt::v7::basic_string_view<char>,char,void>::
       parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                 ((formatter<fmt::v7::basic_string_view<char>,char,void> *)local_60,parse_ctx);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::advance_to(parse_ctx,it);
  this = f.super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.
         name.size_;
  it_00 = formatter<baryonyx::solver_parameters::pre_constraint_order,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<baryonyx::solver_parameters::pre_constraint_order,char,void> *)
                     local_60,*arg,
                     (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     f.super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
                     precision_ref.val.name.size_);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)this,it_00);
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }